

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall mpt::item<mpt::layout::graph>::item(item<mpt::layout::graph> *this,graph *ref)

{
  (this->super_reference<mpt::layout::graph>)._ref = ref;
  identifier::identifier(&this->super_identifier,0x18);
  return;
}

Assistant:

item(T *ref = 0) : reference<T>(ref), identifier(sizeof(identifier) + sizeof(_post))
	{ }